

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit(SemanticAnalysisVisitor *this,ParamList *par_list,void *data)

{
  bool bVar1;
  pointer pSVar2;
  long in_RSI;
  SemanticAnalysisVisitor *in_RDI;
  NameListData name_list_data;
  NameListData local_20 [2];
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x19346a);
  if (bVar1) {
    NameListData::NameListData(local_20);
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x193488);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_20);
    *(size_t *)(local_10 + 0x18) = local_20[0].name_count_;
  }
  if ((*(byte *)(local_10 + 0x10) & 1) != 0) {
    SetFunctionVararg(in_RDI);
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(ParamList *par_list, void *data)
    {
        if (par_list->name_list_)
        {
            NameListData name_list_data;
            par_list->name_list_->Accept(this, &name_list_data);
            par_list->fix_arg_count_ = name_list_data.name_count_;
        }

        if (par_list->vararg_)
            SetFunctionVararg();
    }